

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::RsElseClauseSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,RsElseClauseSyntax *this,size_t index)

{
  Token token;
  RsProdItemSyntax *node;
  size_t index_local;
  RsElseClauseSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->keyword).kind;
    token._2_1_ = (this->keyword).field_0x2;
    token.numFlags.raw = (this->keyword).numFlags.raw;
    token.rawLen = (this->keyword).rawLen;
    token.info = (this->keyword).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    node = not_null<slang::syntax::RsProdItemSyntax_*>::get(&this->item);
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(SyntaxNode *)node);
  }
  else {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax RsElseClauseSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return keyword;
        case 1: return item.get();
        default: return nullptr;
    }
}